

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  bool bVar1;
  Nonnull<CordRep_*> pCVar2;
  Nonnull<cord_internal::CordRepFlat_*> pCVar3;
  CordzInfo *info;
  CordRep *pCVar4;
  CrcCordState *this_00;
  CrcCordState local_40 [8];
  CordzUpdateScope scope;
  CrcCordState local_30 [8];
  CrcCordState local_28 [8];
  
  bVar1 = empty(this);
  if (bVar1) {
    InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
    absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_28,state);
    pCVar2 = (Nonnull<CordRep_*>)absl::lts_20240722::cord_internal::CordRepCrc::New(0,local_28);
    this_00 = local_28;
  }
  else {
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      info = cord_internal::InlineData::cordz_info((InlineData *)this);
      cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kSetExpectedChecksum);
      pCVar4 = cord_internal::InlineData::as_tree((InlineData *)this);
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_40,state);
      pCVar2 = (Nonnull<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar4,local_40);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_40);
      InlineRep::SetTree(&this->contents_,pCVar2,&scope);
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
      return;
    }
    pCVar3 = InlineRep::MakeFlatWithExtraCapacity(&this->contents_,0);
    absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_30,state);
    pCVar2 = (Nonnull<CordRep_*>)absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar3,local_30)
    ;
    this_00 = local_30;
  }
  absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(this_00);
  InlineRep::EmplaceTree(&this->contents_,pCVar2,kSetExpectedChecksum);
  return;
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}